

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3SafetyCheckSickOrOk(sqlite3 *db)

{
  u32 uVar1;
  u32 magic;
  sqlite3 *db_local;
  
  uVar1 = db->magic;
  if (((uVar1 == 0x4b771290) || (uVar1 == 0xa029a697)) || (uVar1 == 0xf03b7906)) {
    db_local._4_4_ = 1;
  }
  else {
    logBadConnection("invalid");
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3SafetyCheckSickOrOk(sqlite3 *db){
  u32 magic;
  magic = db->magic;
  if( magic!=SQLITE_MAGIC_SICK &&
      magic!=SQLITE_MAGIC_OPEN &&
      magic!=SQLITE_MAGIC_BUSY ){
    testcase( sqlite3GlobalConfig.xLog!=0 );
    logBadConnection("invalid");
    return 0;
  }else{
    return 1;
  }
}